

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::ServiceOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ServiceOptions **v1;
  ServiceOptions **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *other;
  uint32_t *puVar3;
  FeatureSet *pFVar4;
  anon_union_72_1_493b367e_for_ServiceOptions_3 *this_00;
  ServiceOptions *extendee;
  LogMessage local_90;
  Voidify local_79;
  uint local_78;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  ServiceOptions *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  ServiceOptions *from;
  ServiceOptions *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (ServiceOptions *)to_msg;
  _this = (ServiceOptions *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)protobuf::MessageLite::GetArena(to_msg);
  local_50 = (ServiceOptions *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ServiceOptions_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::ServiceOptions*>
                 (&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::ServiceOptions_const*,google::protobuf::ServiceOptions*>
                       (v1,v2,"&from != _this");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x2ec8,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  local_78 = 0;
  this = _internal_mutable_uninterpreted_option(from);
  other = _internal_uninterpreted_option((ServiceOptions *)arena);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom(this,other);
  puVar3 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).first_owner_,0);
  local_78 = *puVar3;
  if ((local_78 & 3) != 0) {
    if ((local_78 & 1) != 0) {
      if ((arena->impl_).first_arena_.cleanup_list_.head_ == (Chunk *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x2ed1,"from._impl_.features_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_90);
      }
      if ((from->field_0)._impl_.features_ == (FeatureSet *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.cleanup_list_.head_;
        local_10 = absl_log_internal_check_op_result;
        pFVar4 = (FeatureSet *)
                 Arena::CopyConstruct<google::protobuf::FeatureSet>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.features_ = pFVar4;
      }
      else {
        FeatureSet::MergeFrom
                  ((from->field_0)._impl_.features_,
                   (FeatureSet *)(arena->impl_).first_arena_.cleanup_list_.head_);
      }
    }
    if ((local_78 & 2) != 0) {
      (from->field_0)._impl_.deprecated_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.cleanup_list_.next_ & 1);
    }
  }
  uVar1 = local_78;
  puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  this_00 = &from->field_0;
  extendee = default_instance();
  internal::ExtensionSet::MergeFrom
            (&(this_00->_impl_)._extensions_,(MessageLite *)extendee,
             (ExtensionSet *)&(arena->impl_).field_0x10);
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void ServiceOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ServiceOptions*>(&to_msg);
  auto& from = static_cast<const ServiceOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ServiceOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}